

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O3

void __thiscall
CTxMemPool::UpdateTransactionsFromBlock
          (CTxMemPool *this,vector<uint256,_std::allocator<uint256>_> *vHashesToUpdate)

{
  Epoch *pEVar1;
  type *ptVar2;
  hasher *phVar3;
  undefined1 *puVar4;
  _Rb_tree_header *p_Var5;
  undefined1 auVar6 [16];
  pointer puVar7;
  uchar *puVar8;
  bool bVar9;
  iterator iVar10;
  iterator child;
  const_iterator cVar11;
  _Base_ptr p_Var12;
  _Base_ptr p_Var13;
  key_type *__k;
  __normal_iterator<const_uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_> __tmp;
  pointer puVar14;
  long in_FS_OFFSET;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  Guard epoch_guard_5;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> descendants_to_remove;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> setAlreadyIncluded;
  cacheMap mapMemPoolDescendantsToUpdate;
  COutPoint local_f8;
  _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
  local_c8;
  _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
  local_98;
  _Rb_tree<_3afb3733_> local_68;
  long local_38;
  pointer puVar15;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  std::set<uint256,std::less<uint256>,std::allocator<uint256>>::
  set<__gnu_cxx::__normal_iterator<uint256_const*,std::vector<uint256,std::allocator<uint256>>>>
            ((set<uint256,std::less<uint256>,std::allocator<uint256>> *)&local_98,
             (vHashesToUpdate->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (vHashesToUpdate->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  local_c8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c8._M_impl.super__Rb_tree_header._M_header;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c8._M_impl.super__Rb_tree_header._M_node_count = 0;
  puVar7 = (vHashesToUpdate->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar14 = (vHashesToUpdate->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c8._M_impl.super__Rb_tree_header._M_header._M_left;
  if (puVar14 != puVar7) {
    ptVar2 = &(this->mapTx).super_type;
    phVar3 = &(this->mapTx).super_type.hash_;
    puVar4 = &(this->mapTx).super_type.field_0x68;
    p_Var5 = &(this->mapNextTx).m._M_t._M_impl.super__Rb_tree_header;
    pEVar1 = &this->m_epoch;
    do {
      puVar15 = puVar14 + -1;
      iVar10 = boost::multi_index::detail::
               hashed_index<mempoolentry_txid,SaltedTxidHasher,std::equal_to<uint256>,boost::multi_index::detail::nth_layer<1,CTxMemPoolEntry,CTxMemPool::CTxMemPoolEntry_Indices,std::allocator<CTxMemPoolEntry>>,boost::mpl::vector0<mpl_::na>,boost::multi_index::detail::hashed_unique_tag>
               ::find<uint256,SaltedTxidHasher,std::equal_to<uint256>>
                         ((hashed_index<mempoolentry_txid,SaltedTxidHasher,std::equal_to<uint256>,boost::multi_index::detail::nth_layer<1,CTxMemPoolEntry,CTxMemPool::CTxMemPoolEntry_Indices,std::allocator<CTxMemPoolEntry>>,boost::mpl::vector0<mpl_::na>,boost::multi_index::detail::hashed_unique_tag>
                           *)ptVar2,puVar15,phVar3,puVar4);
      if (iVar10.node !=
          (this->mapTx).
          super_header_holder<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>_*,_boost::multi_index::multi_index_container<CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>_>
          .member) {
        local_f8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
             *(undefined8 *)(puVar15->super_base_blob<256U>).m_data._M_elems;
        local_f8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
             *(undefined8 *)(puVar14[-1].super_base_blob<256U>.m_data._M_elems + 8);
        local_f8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
             *(undefined8 *)(puVar14[-1].super_base_blob<256U>.m_data._M_elems + 0x10);
        local_f8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ =
             *(undefined8 *)(puVar14[-1].super_base_blob<256U>.m_data._M_elems + 0x18);
        local_f8.n = 0;
        p_Var13 = (this->mapNextTx).m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var12 = &p_Var5->_M_header;
        for (; (_Rb_tree_header *)p_Var13 != (_Rb_tree_header *)0x0;
            p_Var13 = (&p_Var13->_M_left)[bVar9]) {
          bVar9 = ::operator<(*(COutPoint **)(p_Var13 + 1),&local_f8);
          if (!bVar9) {
            p_Var12 = p_Var13;
          }
        }
        local_f8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = pEVar1;
        if ((this->m_epoch).m_guarded == true) {
          __assert_fail("!m_epoch.m_guarded",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/util/epochguard.h"
                        ,0x4b,"Epoch::Guard::Guard(Epoch &)");
        }
        (this->m_epoch).m_raw_epoch = (this->m_epoch).m_raw_epoch + 1;
        (this->m_epoch).m_guarded = true;
        if ((_Rb_tree_header *)p_Var12 != p_Var5) {
          do {
            puVar8 = *(uchar **)(p_Var12 + 1);
            auVar6 = *(undefined1 (*) [16])(puVar8 + 0x10);
            auVar17[0] = -((puVar15->super_base_blob<256U>).m_data._M_elems[0] == *puVar8);
            auVar17[1] = -(puVar14[-1].super_base_blob<256U>.m_data._M_elems[1] == puVar8[1]);
            auVar17[2] = -(puVar14[-1].super_base_blob<256U>.m_data._M_elems[2] == puVar8[2]);
            auVar17[3] = -(puVar14[-1].super_base_blob<256U>.m_data._M_elems[3] == puVar8[3]);
            auVar17[4] = -(puVar14[-1].super_base_blob<256U>.m_data._M_elems[4] == puVar8[4]);
            auVar17[5] = -(puVar14[-1].super_base_blob<256U>.m_data._M_elems[5] == puVar8[5]);
            auVar17[6] = -(puVar14[-1].super_base_blob<256U>.m_data._M_elems[6] == puVar8[6]);
            auVar17[7] = -(puVar14[-1].super_base_blob<256U>.m_data._M_elems[7] == puVar8[7]);
            auVar17[8] = -(puVar14[-1].super_base_blob<256U>.m_data._M_elems[8] == puVar8[8]);
            auVar17[9] = -(puVar14[-1].super_base_blob<256U>.m_data._M_elems[9] == puVar8[9]);
            auVar17[10] = -(puVar14[-1].super_base_blob<256U>.m_data._M_elems[10] == puVar8[10]);
            auVar17[0xb] = -(puVar14[-1].super_base_blob<256U>.m_data._M_elems[0xb] == puVar8[0xb]);
            auVar17[0xc] = -(puVar14[-1].super_base_blob<256U>.m_data._M_elems[0xc] == puVar8[0xc]);
            auVar17[0xd] = -(puVar14[-1].super_base_blob<256U>.m_data._M_elems[0xd] == puVar8[0xd]);
            auVar17[0xe] = -(puVar14[-1].super_base_blob<256U>.m_data._M_elems[0xe] == puVar8[0xe]);
            auVar17[0xf] = -(puVar14[-1].super_base_blob<256U>.m_data._M_elems[0xf] == puVar8[0xf]);
            auVar16[0] = -(puVar14[-1].super_base_blob<256U>.m_data._M_elems[0x10] == auVar6[0]);
            auVar16[1] = -(puVar14[-1].super_base_blob<256U>.m_data._M_elems[0x11] == auVar6[1]);
            auVar16[2] = -(puVar14[-1].super_base_blob<256U>.m_data._M_elems[0x12] == auVar6[2]);
            auVar16[3] = -(puVar14[-1].super_base_blob<256U>.m_data._M_elems[0x13] == auVar6[3]);
            auVar16[4] = -(puVar14[-1].super_base_blob<256U>.m_data._M_elems[0x14] == auVar6[4]);
            auVar16[5] = -(puVar14[-1].super_base_blob<256U>.m_data._M_elems[0x15] == auVar6[5]);
            auVar16[6] = -(puVar14[-1].super_base_blob<256U>.m_data._M_elems[0x16] == auVar6[6]);
            auVar16[7] = -(puVar14[-1].super_base_blob<256U>.m_data._M_elems[0x17] == auVar6[7]);
            auVar16[8] = -(puVar14[-1].super_base_blob<256U>.m_data._M_elems[0x18] == auVar6[8]);
            auVar16[9] = -(puVar14[-1].super_base_blob<256U>.m_data._M_elems[0x19] == auVar6[9]);
            auVar16[10] = -(puVar14[-1].super_base_blob<256U>.m_data._M_elems[0x1a] == auVar6[10]);
            auVar16[0xb] = -(puVar14[-1].super_base_blob<256U>.m_data._M_elems[0x1b] == auVar6[0xb])
            ;
            auVar16[0xc] = -(puVar14[-1].super_base_blob<256U>.m_data._M_elems[0x1c] == auVar6[0xc])
            ;
            auVar16[0xd] = -(puVar14[-1].super_base_blob<256U>.m_data._M_elems[0x1d] == auVar6[0xd])
            ;
            auVar16[0xe] = -(puVar14[-1].super_base_blob<256U>.m_data._M_elems[0x1e] == auVar6[0xe])
            ;
            auVar16[0xf] = -(puVar14[-1].super_base_blob<256U>.m_data._M_elems[0x1f] == auVar6[0xf])
            ;
            auVar16 = auVar16 & auVar17;
            if ((ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar16[0xf] >> 7) << 0xf) != 0xffff) break;
            __k = (key_type *)((long)&p_Var12[1]._M_parent[1]._M_right + 1);
            child = boost::multi_index::detail::
                    hashed_index<mempoolentry_txid,SaltedTxidHasher,std::equal_to<uint256>,boost::multi_index::detail::nth_layer<1,CTxMemPoolEntry,CTxMemPool::CTxMemPoolEntry_Indices,std::allocator<CTxMemPoolEntry>>,boost::mpl::vector0<mpl_::na>,boost::multi_index::detail::hashed_unique_tag>
                    ::find<uint256,SaltedTxidHasher,std::equal_to<uint256>>
                              ((hashed_index<mempoolentry_txid,SaltedTxidHasher,std::equal_to<uint256>,boost::multi_index::detail::nth_layer<1,CTxMemPoolEntry,CTxMemPool::CTxMemPoolEntry_Indices,std::allocator<CTxMemPoolEntry>>,boost::mpl::vector0<mpl_::na>,boost::multi_index::detail::hashed_unique_tag>
                                *)ptVar2,__k,phVar3,puVar4);
            if (child.node ==
                (this->mapTx).
                super_header_holder<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>_*,_boost::multi_index::multi_index_container<CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>_>
                .member) {
              __assert_fail("childIter != mapTx.end()",
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/txmempool.cpp"
                            ,0x8b,
                            "void CTxMemPool::UpdateTransactionsFromBlock(const std::vector<uint256> &)"
                           );
            }
            if ((this->m_epoch).m_guarded == false) {
              __assert_fail("m_guarded",
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/util/epochguard.h"
                            ,0x59,"bool Epoch::visited(Marker &) const");
            }
            if (*(ulong *)((long)&((child.node)->
                                  super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                                  ).
                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                                  .
                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                                  .
                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                                  .
                                  super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>
                                  .super_pod_value_holder<CTxMemPoolEntry>.space + 0x108) <
                pEVar1->m_raw_epoch) {
              *(uint64_t *)
               ((long)&((child.node)->
                       super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                       ).
                       super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                       .
                       super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                       .
                       super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                       .super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>.
                       super_pod_value_holder<CTxMemPoolEntry>.space + 0x108) = pEVar1->m_raw_epoch;
              cVar11 = std::
                       _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
                       ::find(&local_98,__k);
              if ((_Rb_tree_header *)cVar11._M_node == &local_98._M_impl.super__Rb_tree_header) {
                UpdateChild(this,(txiter)iVar10.node,(txiter)child.node,true);
                UpdateParent(this,(txiter)child.node,(txiter)iVar10.node,true);
              }
            }
            p_Var12 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var12);
          } while ((_Rb_tree_header *)p_Var12 != p_Var5);
          if (((this->m_epoch).m_guarded & 1U) == 0) {
            __assert_fail("m_epoch.m_guarded",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/util/epochguard.h"
                          ,0x51,"Epoch::Guard::~Guard()");
          }
        }
        (this->m_epoch).m_raw_epoch = (this->m_epoch).m_raw_epoch + 1;
        (this->m_epoch).m_guarded = false;
        UpdateForDescendants
                  (this,(txiter)iVar10.node,(cacheMap *)&local_68,
                   (set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)&local_98,
                   (set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)&local_c8);
      }
      puVar14 = puVar15;
      p_Var13 = local_c8._M_impl.super__Rb_tree_header._M_header._M_left;
    } while (puVar15 != puVar7);
    for (; (_Rb_tree_header *)p_Var13 != &local_c8._M_impl.super__Rb_tree_header;
        p_Var13 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var13)) {
      iVar10 = boost::multi_index::detail::
               hashed_index<mempoolentry_txid,SaltedTxidHasher,std::equal_to<uint256>,boost::multi_index::detail::nth_layer<1,CTxMemPoolEntry,CTxMemPool::CTxMemPoolEntry_Indices,std::allocator<CTxMemPoolEntry>>,boost::mpl::vector0<mpl_::na>,boost::multi_index::detail::hashed_unique_tag>
               ::find<uint256,SaltedTxidHasher,std::equal_to<uint256>>
                         ((hashed_index<mempoolentry_txid,SaltedTxidHasher,std::equal_to<uint256>,boost::multi_index::detail::nth_layer<1,CTxMemPoolEntry,CTxMemPool::CTxMemPoolEntry_Indices,std::allocator<CTxMemPoolEntry>>,boost::mpl::vector0<mpl_::na>,boost::multi_index::detail::hashed_unique_tag>
                           *)ptVar2,p_Var13 + 1,phVar3,puVar4);
      if (iVar10.node !=
          (this->mapTx).
          super_header_holder<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>_*,_boost::multi_index::multi_index_container<CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>_>
          .member) {
        removeRecursive(this,*(CTransaction **)
                              &((iVar10.node)->
                               super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                               ).
                               super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                               .
                               super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                               .
                               super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                               .
                               super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>
                               .super_pod_value_holder<CTxMemPoolEntry>.space,SIZELIMIT);
      }
    }
  }
  std::
  _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
  ::~_Rb_tree(&local_c8);
  std::
  _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
  ::~_Rb_tree(&local_98);
  std::_Rb_tree<$3afb3733$>::~_Rb_tree(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CTxMemPool::UpdateTransactionsFromBlock(const std::vector<uint256>& vHashesToUpdate)
{
    AssertLockHeld(cs);
    // For each entry in vHashesToUpdate, store the set of in-mempool, but not
    // in-vHashesToUpdate transactions, so that we don't have to recalculate
    // descendants when we come across a previously seen entry.
    cacheMap mapMemPoolDescendantsToUpdate;

    // Use a set for lookups into vHashesToUpdate (these entries are already
    // accounted for in the state of their ancestors)
    std::set<uint256> setAlreadyIncluded(vHashesToUpdate.begin(), vHashesToUpdate.end());

    std::set<uint256> descendants_to_remove;

    // Iterate in reverse, so that whenever we are looking at a transaction
    // we are sure that all in-mempool descendants have already been processed.
    // This maximizes the benefit of the descendant cache and guarantees that
    // CTxMemPoolEntry::m_children will be updated, an assumption made in
    // UpdateForDescendants.
    for (const uint256& hash : vHashesToUpdate | std::views::reverse) {
        // calculate children from mapNextTx
        txiter it = mapTx.find(hash);
        if (it == mapTx.end()) {
            continue;
        }
        auto iter = mapNextTx.lower_bound(COutPoint(Txid::FromUint256(hash), 0));
        // First calculate the children, and update CTxMemPoolEntry::m_children to
        // include them, and update their CTxMemPoolEntry::m_parents to include this tx.
        // we cache the in-mempool children to avoid duplicate updates
        {
            WITH_FRESH_EPOCH(m_epoch);
            for (; iter != mapNextTx.end() && iter->first->hash == hash; ++iter) {
                const uint256 &childHash = iter->second->GetHash();
                txiter childIter = mapTx.find(childHash);
                assert(childIter != mapTx.end());
                // We can skip updating entries we've encountered before or that
                // are in the block (which are already accounted for).
                if (!visited(childIter) && !setAlreadyIncluded.count(childHash)) {
                    UpdateChild(it, childIter, true);
                    UpdateParent(childIter, it, true);
                }
            }
        } // release epoch guard for UpdateForDescendants
        UpdateForDescendants(it, mapMemPoolDescendantsToUpdate, setAlreadyIncluded, descendants_to_remove);
    }

    for (const auto& txid : descendants_to_remove) {
        // This txid may have been removed already in a prior call to removeRecursive.
        // Therefore we ensure it is not yet removed already.
        if (const std::optional<txiter> txiter = GetIter(txid)) {
            removeRecursive((*txiter)->GetTx(), MemPoolRemovalReason::SIZELIMIT);
        }
    }
}